

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall
discordpp::GuildMember::GuildMember
          (GuildMember *this,omittable_field<discordpp::User> *user,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *nick,nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *avatar,
          field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_> *roles,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *joined_at,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *premium_since,field<bool> *deaf,field<bool> *mute,field<int> *flags,
          omittable_field<bool> *pending,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *permissions,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *communication_disabled_until)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  _Head_base<0UL,_int_*,_false> _Var4;
  pointer *__ptr;
  
  field<discordpp::User>::field
            (&(this->user).super_field<discordpp::User>,&user->super_field<discordpp::User>);
  (this->user)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a6c8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->nick).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&nick->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->nick)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a2b0;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->avatar).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&avatar->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->avatar)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a2b0;
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&this->roles,roles);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->joined_at,joined_at);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->premium_since).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&premium_since->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->premium_since)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a2b0;
  _Var1._M_head_impl =
       (deaf->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (bool *)0x0) {
    _Var3._M_head_impl = (bool *)0x0;
  }
  else {
    _Var3._M_head_impl = (bool *)operator_new(1);
    *_Var3._M_head_impl = *_Var1._M_head_impl;
  }
  (this->deaf).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var3._M_head_impl;
  (this->deaf).s_ = deaf->s_;
  _Var1._M_head_impl =
       (mute->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (bool *)0x0) {
    _Var3._M_head_impl = (bool *)0x0;
  }
  else {
    _Var3._M_head_impl = (bool *)operator_new(1);
    *_Var3._M_head_impl = *_Var1._M_head_impl;
  }
  (this->mute).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var3._M_head_impl;
  (this->mute).s_ = mute->s_;
  _Var2._M_head_impl =
       (flags->t_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    _Var4._M_head_impl = (int *)0x0;
  }
  else {
    _Var4._M_head_impl = (int *)operator_new(4);
    *_Var4._M_head_impl = *_Var2._M_head_impl;
  }
  (this->flags).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  (this->flags).s_ = flags->s_;
  _Var1._M_head_impl =
       (pending->super_field<bool>).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
       _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (bool *)0x0) {
    _Var3._M_head_impl = (bool *)0x0;
  }
  else {
    _Var3._M_head_impl = (bool *)operator_new(1);
    *_Var3._M_head_impl = *_Var1._M_head_impl;
  }
  (this->pending).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
  _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var3._M_head_impl;
  (this->pending).super_field<bool>.s_ = (pending->super_field<bool>).s_;
  (this->pending)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->permissions).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&permissions->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->permissions)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a360;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->communication_disabled_until).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&communication_disabled_until->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->communication_disabled_until)._vptr_nullable_omittable_field =
       (_func_int **)&PTR_operator__0024a2b0;
  return;
}

Assistant:

GuildMember(
        omittable_field<User> user = omitted,
        nullable_omittable_field<std::string> nick = omitted,
        nullable_omittable_field<std::string> avatar = omitted,
        field<std::vector<Snowflake> > roles = uninitialized,
        field<Timestamp> joined_at = uninitialized,
        nullable_omittable_field<Timestamp> premium_since = omitted,
        field<bool> deaf = uninitialized,
        field<bool> mute = uninitialized,
        field<int> flags = uninitialized,
        omittable_field<bool> pending = omitted,
        omittable_field<std::string> permissions = omitted,
        nullable_omittable_field<Timestamp> communication_disabled_until = omitted
    ):
        user(user),
        nick(nick),
        avatar(avatar),
        roles(roles),
        joined_at(joined_at),
        premium_since(premium_since),
        deaf(deaf),
        mute(mute),
        flags(flags),
        pending(pending),
        permissions(permissions),
        communication_disabled_until(communication_disabled_until)
    {}